

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

void Part_ManRecycle(Part_Man_t *p,char *pMemory,int nSize)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  iVar3 = nSize / p->nStepSize;
  bVar2 = 0 < nSize % p->nStepSize;
  uVar6 = iVar3 + (uint)bVar2;
  pVVar1 = p->vFree;
  if ((int)uVar6 < pVVar1->nSize) goto LAB_00604323;
  iVar7 = iVar3 + (uint)bVar2 + 1;
  iVar3 = pVVar1->nCap;
  iVar8 = iVar3 * 2;
  if ((int)uVar6 < iVar8) {
    if (iVar3 < iVar8 && iVar3 <= (int)uVar6) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar3 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar1->pArray,(long)iVar3 << 4);
      }
      pVVar1->pArray = ppvVar4;
LAB_006042fd:
      pVVar1->nCap = iVar8;
    }
  }
  else if (iVar3 <= (int)uVar6) {
    if (pVVar1->pArray == (void **)0x0) {
      ppvVar4 = (void **)malloc((long)iVar7 << 3);
    }
    else {
      ppvVar4 = (void **)realloc(pVVar1->pArray,(long)iVar7 << 3);
    }
    pVVar1->pArray = ppvVar4;
    iVar8 = iVar7;
    goto LAB_006042fd;
  }
  lVar5 = (long)pVVar1->nSize;
  if (pVVar1->nSize <= (int)uVar6) {
    do {
      pVVar1->pArray[lVar5] = (void *)0x0;
      lVar5 = lVar5 + 1;
    } while (iVar7 != lVar5);
  }
  pVVar1->nSize = iVar7;
LAB_00604323:
  if ((-1 < (int)uVar6) && ((int)uVar6 < p->vFree->nSize)) {
    *(void **)pMemory = p->vFree->pArray[uVar6];
    if ((int)uVar6 < p->vFree->nSize) {
      p->vFree->pArray[uVar6] = pMemory;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Part_ManRecycle( Part_Man_t * p, char * pMemory, int nSize )
{
    int Type;
    Type = Part_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    Part_OneSetNext( pMemory, (char *)Vec_PtrEntry(p->vFree, Type) );
    Vec_PtrWriteEntry( p->vFree, Type, pMemory );
}